

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

void __thiscall ncnn::Deconvolution_x86::destroy_pipeline(Deconvolution_x86 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((Deconvolution_x86 *)
                   ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-7]),
                   in_RSI);
  return;
}

Assistant:

int Deconvolution_x86::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}